

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.h
# Opt level: O2

UnicodeString * __thiscall
icu_63::SimpleFormatter::getTextWithNoArguments
          (UnicodeString *__return_storage_ptr__,SimpleFormatter *this)

{
  short sVar1;
  char16_t *compiledPattern;
  int32_t compiledPatternLength;
  
  compiledPattern = UnicodeString::getBuffer(&this->compiledPattern);
  sVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    compiledPatternLength = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    compiledPatternLength = (int)sVar1 >> 5;
  }
  getTextWithNoArguments(__return_storage_ptr__,compiledPattern,compiledPatternLength);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString getTextWithNoArguments() const {
        return getTextWithNoArguments(compiledPattern.getBuffer(), compiledPattern.length());
    }